

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::TypedExpectation
          (TypedExpectation<bool_(n_e_s::core::INesController::Button)> *this,
          FunctionMocker<bool_(n_e_s::core::INesController::Button)> *owner,char *a_file,int a_line,
          string *a_source_text,ArgumentMatcherTuple *m)

{
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002751e8;
  this->owner_ = owner;
  Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&this->matchers_,
             (Matcher<n_e_s::core::INesController::Button> *)m);
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<n_e_s::core::INesController::Button>_&>.
  vtable_ = (VTable *)
            MatcherBase<std::tuple<n_e_s::core::INesController::Button>const&>::
            GetVTable<testing::internal::MatcherBase<std::tuple<n_e_s::core::INesController::Button>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
            ::kVTable;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<n_e_s::core::INesController::Button>_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00275230;
  *(undefined8 *)&(this->repeated_action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->repeated_action_).fun_.super__Function_base._M_functor + 8) = 0;
  (this->repeated_action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->repeated_action_).fun_._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

TypedExpectation(FunctionMocker<F>* owner, const char* a_file, int a_line,
                   const std::string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}